

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horz_superres_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_be2d6c::HorzSuperresEndToEndTest::SetUp(HorzSuperresEndToEndTest *this)

{
  long in_RDI;
  TestMode in_stack_000000bc;
  EncoderTest *in_stack_000000c0;
  
  libaom_test::EncoderTest::InitializeConfig(in_stack_000000c0,in_stack_000000bc);
  *(undefined4 *)(in_RDI + 0x68) = 5;
  *(undefined4 *)(in_RDI + 0x90) = 3;
  *(undefined4 *)(in_RDI + 0xb8) = 0x28;
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x408);
  *(undefined4 *)(in_RDI + 0x54) = *(undefined4 *)(in_RDI + 0x404);
  *(undefined4 *)(in_RDI + 0x50) = *(undefined4 *)(in_RDI + 0x404);
  *(undefined8 *)(in_RDI + 0x3e0) = 0x10000;
  if (8 < *(int *)(in_RDI + 0x50)) {
    *(ulong *)(in_RDI + 0x3e0) = *(ulong *)(in_RDI + 0x3e0) | 0x40000;
  }
  *(undefined4 *)(in_RDI + 0x7c) = *(undefined4 *)(in_RDI + 0x428);
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(::libaom_test::kTwoPassGood);
    cfg_.g_lag_in_frames = 5;
    cfg_.rc_end_usage = AOM_Q;
    cfg_.rc_target_bitrate = kBitrate;
    cfg_.g_error_resilient = 0;
    cfg_.g_profile = test_video_param_.profile;
    cfg_.g_input_bit_depth = (unsigned int)test_video_param_.bit_depth;
    cfg_.g_bit_depth = test_video_param_.bit_depth;
    init_flags_ = AOM_CODEC_USE_PSNR;
    if (cfg_.g_bit_depth > 8) init_flags_ |= AOM_CODEC_USE_HIGHBITDEPTH;

    // Set superres parameters
    cfg_.rc_superres_mode = superres_mode_;
  }